

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

void P_AutoUseHealth(player_t *player,int saveHealth)

{
  uint uVar1;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  TArray<AInventory_*,_AInventory_*> *pTVar6;
  AInventory *pAVar7;
  ulong uVar8;
  int iVar9;
  AInventory *pAVar10;
  bool bVar11;
  TArray<AInventory_*,_AInventory_*> LargeHealthItems;
  TArray<AInventory_*,_AInventory_*> NormalHealthItems;
  int local_5c;
  TArray<AInventory_*,_AInventory_*> local_58;
  TArray<AInventory_*,_AInventory_*> local_48;
  
  local_48.Array = (AInventory **)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  local_58.Array = (AInventory **)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  pAVar10 = (player->mo->super_AActor).Inventory.field_0.p;
  if ((pAVar10 != (AInventory *)0x0) &&
     (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (player->mo->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
    pAVar10 = (AInventory *)0x0;
  }
  local_5c = saveHealth;
  if (pAVar10 != (AInventory *)0x0) {
    do {
      pPVar2 = AHealthPickup::RegistrationInfo.MyClass;
      if (0 < pAVar10->Amount) {
        if ((pAVar10->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar10);
          (pAVar10->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar5 = (pAVar10->super_AActor).super_DThinker.super_DObject.Class;
        bVar11 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar2 && bVar11) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar11 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (bVar11) {
          if (*(int *)&pAVar10->field_0x4fc == 2) {
            TArray<AInventory_*,_AInventory_*>::Grow(&local_58,1);
            pTVar6 = &local_58;
          }
          else {
            if (*(int *)&pAVar10->field_0x4fc != 1) goto LAB_003fcef8;
            TArray<AInventory_*,_AInventory_*>::Grow(&local_48,1);
            pTVar6 = &local_48;
          }
          uVar1 = pTVar6->Count;
          pTVar6->Array[uVar1] = pAVar10;
          pTVar6->Count = uVar1 + 1;
        }
      }
LAB_003fcef8:
      pAVar7 = (pAVar10->super_AActor).Inventory.field_0.p;
      if ((pAVar7 != (AInventory *)0x0) &&
         (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar10->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        pAVar7 = (AInventory *)0x0;
      }
      pAVar10 = pAVar7;
    } while (pAVar7 != (AInventory *)0x0);
  }
  iVar3 = 0;
  iVar9 = 0;
  if ((ulong)local_48._8_8_ >> 0x20 != 0) {
    uVar8 = 0;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (local_48.Array[uVar8]->super_AActor).health * local_48.Array[uVar8]->Amount;
      uVar8 = uVar8 + 1;
    } while ((ulong)local_48._8_8_ >> 0x20 != uVar8);
  }
  if ((ulong)local_58._8_8_ >> 0x20 != 0) {
    uVar8 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (local_58.Array[uVar8]->super_AActor).health * local_58.Array[uVar8]->Amount;
      uVar8 = uVar8 + 1;
    } while ((ulong)local_58._8_8_ >> 0x20 != uVar8);
  }
  iVar4 = G_SkillProperty(SKILLP_AutoUseHealth);
  if ((iVar4 == 0) || (iVar9 < local_5c)) {
    if (iVar3 < local_5c) {
      if ((iVar4 == 0) || (iVar3 + iVar9 < local_5c)) goto LAB_003fd003;
      iVar3 = UseHealthItems(&local_48,&local_5c);
      player->health = player->health + iVar3;
      if (local_5c < 1) goto LAB_003fd003;
      iVar3 = UseHealthItems(&local_58,&local_5c);
    }
    else {
      iVar3 = UseHealthItems(&local_58,&local_5c);
    }
  }
  else {
    iVar3 = UseHealthItems(&local_48,&local_5c);
  }
  player->health = player->health + iVar3;
LAB_003fd003:
  (player->mo->super_AActor).health = player->health;
  TArray<AInventory_*,_AInventory_*>::~TArray(&local_58);
  TArray<AInventory_*,_AInventory_*>::~TArray(&local_48);
  return;
}

Assistant:

void P_AutoUseHealth(player_t *player, int saveHealth)
{
	TArray<AInventory *> NormalHealthItems;
	TArray<AInventory *> LargeHealthItems;

	for(AInventory *inv = player->mo->Inventory; inv != NULL; inv = inv->Inventory)
	{
		if (inv->Amount > 0 && inv->IsKindOf(RUNTIME_CLASS(AHealthPickup)))
		{
			int mode = static_cast<AHealthPickup*>(inv)->autousemode;

			if (mode == 1) NormalHealthItems.Push(inv);
			else if (mode == 2) LargeHealthItems.Push(inv);
		}
	}

	int normalhealth = CountHealth(NormalHealthItems);
	int largehealth = CountHealth(LargeHealthItems);

	bool skilluse = !!G_SkillProperty(SKILLP_AutoUseHealth);

	if (skilluse && normalhealth >= saveHealth)
	{ // Use quartz flasks
		player->health += UseHealthItems(NormalHealthItems, saveHealth);
	}
	else if (largehealth >= saveHealth)
	{ 
		// Use mystic urns
		player->health += UseHealthItems(LargeHealthItems, saveHealth);
	}
	else if (skilluse && normalhealth + largehealth >= saveHealth)
	{ // Use mystic urns and quartz flasks
		player->health += UseHealthItems(NormalHealthItems, saveHealth);
		if (saveHealth > 0) player->health += UseHealthItems(LargeHealthItems, saveHealth);
	}
	player->mo->health = player->health;
}